

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

cio_error stream_write(cio_io_stream *stream,cio_write_buffer *buffer,
                      cio_io_stream_write_handler_t handler,void *handler_context)

{
  cio_error cVar1;
  size_t sVar2;
  int *piVar3;
  size_t sVar4;
  cio_write_buffer *pcVar5;
  size_t sVar6;
  
  cVar1 = CIO_INVALID_ARGUMENT;
  if (((stream != (cio_io_stream *)0x0) && (buffer != (cio_write_buffer *)0x0)) &&
     (handler != (cio_io_stream_write_handler_t)0x0)) {
    sVar6 = (buffer->data).head.q_len;
    if (sVar6 == 0) {
      sVar4 = 0;
    }
    else {
      sVar4 = 0;
      pcVar5 = buffer;
      do {
        sVar6 = sVar6 - 1;
        pcVar5 = pcVar5->next;
        sVar2 = write(*(int *)&stream[0x3a].read_handler_context,
                      (pcVar5->data).element.field_0.const_data,(pcVar5->data).element.length);
        if ((long)sVar2 < 0) {
          piVar3 = __errno_location();
          if (*piVar3 != 0xb) {
            return -*piVar3;
          }
          stream->write_handler = handler;
          stream->write_handler_context = handler_context;
          stream->write_buffer = buffer;
          stream[0x3a].read_handler = (cio_io_stream_read_handler_t)stream;
          stream[0x3a].close = write_callback;
          cVar1 = cio_linux_eventloop_register_write
                            ((cio_eventloop *)stream[0x3a].read_buffer,
                             (cio_event_notifier *)&stream[0x3a].write_some);
          return cVar1;
        }
        sVar4 = sVar4 + sVar2;
      } while ((sVar2 == (pcVar5->data).element.length) && (sVar6 != 0));
    }
    (*handler)(stream,handler_context,buffer,CIO_SUCCESS,sVar4);
    cVar1 = CIO_SUCCESS;
  }
  return cVar1;
}

Assistant:

static enum cio_error stream_write(struct cio_io_stream *stream, struct cio_write_buffer *buffer, cio_io_stream_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely((stream == NULL) || (buffer == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	struct cio_uart *uart = cio_container_of(stream, struct cio_uart, stream);
	size_t chain_length = cio_write_buffer_get_num_buffer_elements(buffer);

	const struct cio_write_buffer *write_buffer = buffer->next;
	size_t written = 0;
	bool write_error = false;
	for (size_t i = 0; i < chain_length; i++) {
		ssize_t ret = write(uart->impl.ev.fd, write_buffer->data.element.data, write_buffer->data.element.length);
		if (cio_likely(ret >= 0)) {
			written += (size_t)ret;
			if ((size_t)ret != write_buffer->data.element.length) {
				break;
			}
		} else {
			write_error = true;
			break;
		}

		write_buffer = write_buffer->next;
	}

	if (cio_likely(!write_error)) {
		handler(stream, handler_context, buffer, CIO_SUCCESS, written);
		return CIO_SUCCESS;
	}

	if (cio_likely(errno == EAGAIN)) {
		uart->stream.write_handler = handler;
		uart->stream.write_handler_context = handler_context;
		uart->stream.write_buffer = buffer;
		uart->impl.ev.context = stream;
		uart->impl.ev.write_callback = write_callback;
		return cio_linux_eventloop_register_write(uart->impl.loop, &uart->impl.ev);
	}

	return (enum cio_error)(-errno);
}